

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool square_set_trap_timeout(chunk *c,loc grid,_Bool domsg,wchar_t t_idx,wchar_t time)

{
  trap *ptVar1;
  _Bool _Var2;
  _Bool _Var3;
  square *psVar4;
  trap *ptVar5;
  
  _Var2 = square_in_bounds((chunk_conflict *)c,grid);
  if (!_Var2) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                  ,0x292,
                  "_Bool square_set_trap_timeout(struct chunk *, struct loc, _Bool, int, int)");
  }
  psVar4 = square((chunk_conflict *)c,grid);
  _Var2 = false;
  ptVar1 = psVar4->trap;
  do {
    while( true ) {
      ptVar5 = ptVar1;
      if (ptVar5 == (trap *)0x0) goto LAB_001c527a;
      ptVar1 = ptVar5->next;
      if ((L'\xffffffff' < t_idx) && ((uint)ptVar5->t_idx != t_idx)) break;
      ptVar5->timeout = (uint8_t)time;
      _Var2 = true;
      if (domsg) {
        msg("You have disabled the %s.",ptVar5->kind->name);
      }
    }
  } while (ptVar1 != (trap *)0x0);
LAB_001c527a:
  _Var3 = square_isseen((chunk_conflict *)c,grid);
  if (_Var3) {
    square_memorize_traps(c,grid);
    square_light_spot(c,grid);
  }
  return _Var2;
}

Assistant:

bool square_set_trap_timeout(struct chunk *c, struct loc grid, bool domsg,
							 int t_idx, int time)
{
	bool disabled = false;
	struct trap *current_trap = NULL;

	/* Bounds check */
	assert(square_in_bounds(c, grid));

	/* Look at the traps in this grid */
	current_trap = square(c, grid)->trap;
	while (current_trap) {
		/* Get the next trap (may be NULL) */
		struct trap *next_trap = current_trap->next;

		/* If called with a specific index, skip others */
		if ((t_idx >= 0) && (t_idx != current_trap->t_idx)) {
			if (!next_trap) break;
			current_trap = next_trap;
			continue;
		}

		/* Set the timer */
		current_trap->timeout = time;
		disabled = true;

		/* Message if requested */
		if (domsg) {
			msg("You have disabled the %s.",
				current_trap->kind->name);
		}

		/* Replace with the next trap */
		current_trap = next_trap;
	}

	/* Refresh grids that the character can see */
	if (square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return disabled;
}